

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,Texture2DView *src,float *texCoord,ReferenceParams *params)

{
  Texture2DView TVar1;
  undefined1 local_58 [8];
  Vec4 tq;
  Vec4 sq;
  Texture2DView view;
  ReferenceParams *params_local;
  float *texCoord_local;
  Texture2DView *src_local;
  SurfaceAccess *dst_local;
  
  TVar1 = getSubView(src,params->baseLevel,params->maxLevel);
  sq.m_data[2] = (float)TVar1.m_numLevels;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(tq.m_data + 2),*texCoord,texCoord[2],texCoord[4],texCoord[6]);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)local_58,texCoord[1],texCoord[3],texCoord[5],texCoord[7]);
  if (((params->super_RenderParams).flags & 1) == 0) {
    sampleTextureNonProjected
              (dst,(Texture2DView *)(sq.m_data + 2),(Vec4 *)(tq.m_data + 2),(Vec4 *)local_58,params)
    ;
  }
  else {
    sampleTextureProjected
              (dst,(Texture2DView *)(sq.m_data + 2),(Vec4 *)(tq.m_data + 2),(Vec4 *)local_58,params)
    ;
  }
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::Texture2DView& src, const float* texCoord, const ReferenceParams& params)
{
	const tcu::Texture2DView	view	= getSubView(src, params.baseLevel, params.maxLevel);
	const tcu::Vec4				sq		= tcu::Vec4(texCoord[0+0], texCoord[2+0], texCoord[4+0], texCoord[6+0]);
	const tcu::Vec4				tq		= tcu::Vec4(texCoord[0+1], texCoord[2+1], texCoord[4+1], texCoord[6+1]);

	if (params.flags & ReferenceParams::PROJECTED)
		sampleTextureProjected(dst, view, sq, tq, params);
	else
		sampleTextureNonProjected(dst, view, sq, tq, params);
}